

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,int *prNotFound)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  Select *pSVar5;
  SrcList *pSVar6;
  Table *pTab;
  Expr *pRight;
  sqlite3 *db;
  char cVar7;
  uint uVar8;
  uint uVar9;
  Vdbe *p;
  CollSeq *pCVar10;
  CollSeq *pCVar11;
  KeyInfo *zP4;
  Vdbe *pVVar12;
  int iVar13;
  Schema **ppSVar14;
  int iVar15;
  ulong uVar16;
  Index *pIdx;
  int iVar17;
  bool bVar18;
  
  iVar15 = pParse->nTab;
  pParse->nTab = iVar15 + 1;
  p = sqlite3GetVdbe(pParse);
  if ((((((((pX->flags & 0x800) != 0) &&
          (pSVar5 = (pX->x).pSelect, pSVar5 != (Select *)0x0 && pParse->nErr == 0)) &&
         (pSVar5->pPrior == (Select *)0x0)) &&
        (((pSVar5->selFlags & 5) == 0 && (pSVar5->pLimit == (Expr *)0x0)))) &&
       ((pSVar5->pWhere == (Expr *)0x0 &&
        ((pSVar6 = pSVar5->pSrc, pSVar6->nSrc == 1 && (pSVar6->a[0].pSelect == (Select *)0x0))))))
      && (pTab = pSVar6->a[0].pTab, pTab != (Table *)0x0)) &&
     ((((pTab->tabFlags & 0x10) == 0 && (pSVar5->pEList->nExpr == 1)) &&
      (pRight = pSVar5->pEList->a->pExpr, pRight->op == 0x98)))) {
    db = pParse->db;
    sVar4 = pRight->iColumn;
    uVar8 = (uint)sVar4;
    if (pTab->pSchema == (Schema *)0x0) {
      uVar16 = 0xfff0bdc0;
    }
    else {
      uVar9 = db->nDb;
      if ((int)uVar9 < 1) {
        uVar16 = 0;
      }
      else {
        ppSVar14 = &db->aDb->pSchema;
        uVar16 = 0;
        do {
          if (*ppSVar14 == pTab->pSchema) goto LAB_00196673;
          uVar16 = uVar16 + 1;
          ppSVar14 = ppSVar14 + 4;
        } while (uVar9 != uVar16);
        uVar16 = (ulong)uVar9;
      }
    }
LAB_00196673:
    iVar17 = (int)uVar16;
    sqlite3CodeVerifySchema(pParse,iVar17);
    sqlite3TableLock(pParse,iVar17,pTab->tnum,'\0',pTab->zName);
    if (sVar4 < 0) {
      pVVar12 = sqlite3GetVdbe(pParse);
      iVar13 = pParse->nOnce;
      pParse->nOnce = iVar13 + 1;
      uVar8 = sqlite3VdbeAddOp3(pVVar12,0x1a,iVar13,0,0);
      sqlite3OpenTable(pParse,iVar15,iVar17,pTab,0x27);
      iVar17 = 1;
      if ((-1 < (int)uVar8) && (uVar8 < (uint)p->nOp)) {
        p->aOp[uVar8].p2 = p->nOp;
      }
LAB_0019675e:
      pX->iTable = iVar15;
      return iVar17;
    }
    pCVar10 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pRight);
    cVar2 = pTab->aCol[uVar8].affinity;
    cVar7 = comparisonAffinity(pX);
    if (cVar7 == 'b') {
      bVar18 = true;
    }
    else if (cVar7 == 'a') {
      bVar18 = cVar2 == 'a';
    }
    else {
      bVar18 = 'b' < cVar2;
    }
    pIdx = pTab->pIndex;
    if ((pIdx != (Index *)0x0) && (bVar18)) {
      do {
        if (((*pIdx->aiColumn == uVar8) &&
            (pCVar11 = sqlite3FindCollSeq(db,db->aDb->pSchema->enc,*pIdx->azColl,0),
            pCVar11 == pCVar10)) &&
           ((prNotFound != (int *)0x0 || ((pIdx->nColumn == 1 && (pIdx->onError != '\0')))))) {
          zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
          pVVar12 = sqlite3GetVdbe(pParse);
          iVar13 = pParse->nOnce;
          pParse->nOnce = iVar13 + 1;
          uVar9 = sqlite3VdbeAddOp3(pVVar12,0x1a,iVar13,0,0);
          iVar17 = sqlite3VdbeAddOp3(p,0x27,iVar15,pIdx->tnum,iVar17);
          sqlite3VdbeChangeP4(p,iVar17,(char *)zP4,-0x10);
          bVar3 = *pIdx->aSortOrder;
          if ((-1 < (int)uVar9) && (uVar9 < (uint)p->nOp)) {
            p->aOp[uVar9].p2 = p->nOp;
          }
          iVar17 = bVar3 + 3;
          if ((prNotFound != (int *)0x0) && (pTab->aCol[uVar8].notNull == '\0')) {
            iVar13 = pParse->nMem + 1;
            pParse->nMem = iVar13;
            *prNotFound = iVar13;
            sqlite3VdbeAddOp3(p,10,0,iVar13,0);
          }
          goto LAB_0019675e;
        }
        pIdx = pIdx->pNext;
      } while (pIdx != (Index *)0x0);
    }
  }
  dVar1 = pParse->nQueryLoop;
  if (prNotFound == (int *)0x0) {
    pParse->nQueryLoop = 1.0;
    iVar15 = 2;
    iVar17 = 0;
    if (pX->pLeft->iColumn < 0) {
      uVar8 = (uint)((pX->flags & 0x800) == 0);
      iVar15 = 2 - uVar8;
    }
    else {
      uVar8 = 0;
    }
  }
  else {
    iVar17 = pParse->nMem + 1;
    pParse->nMem = iVar17;
    *prNotFound = iVar17;
    uVar8 = 0;
    sqlite3VdbeAddOp3(p,10,0,iVar17,0);
    iVar15 = 2;
  }
  sqlite3CodeSubselect(pParse,pX,iVar17,uVar8);
  pParse->nQueryLoop = dVar1;
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, int *prNotFound){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique = (prNotFound==0);   /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    int iCol;                              /* Index of column <column> */
    int iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = pExpr->iColumn;
   
    /* Code an OP_VerifyCookie and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr;

      iAddr = sqlite3CodeOnce(pParse);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nColumn==1 && pIdx->onError!=OE_None))
        ){
          int iAddr;
          char *pKey;
  
          pKey = (char *)sqlite3IndexKeyinfo(pParse, pIdx);
          iAddr = sqlite3CodeOnce(pParse);
  
          sqlite3VdbeAddOp4(v, OP_OpenRead, iTab, pIdx->tnum, iDb,
                               pKey,P4_KEYINFO_HANDOFF);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          sqlite3VdbeJumpHere(v, iAddr);
          if( prNotFound && !pTab->aCol[iCol].notNull ){
            *prNotFound = ++pParse->nMem;
            sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
          }
        }
      }
    }
  }

  if( eType==0 ){
    /* Could not found an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    double savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( prNotFound ){
      *prNotFound = rMayHaveNull = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, *prNotFound);
    }else{
      testcase( pParse->nQueryLoop>(double)1 );
      pParse->nQueryLoop = (double)1;
      if( pX->pLeft->iColumn<0 && !ExprHasAnyProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}